

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::TrimCapabilitiesPass::addInstructionRequirements
          (TrimCapabilitiesPass *this,Instruction *instruction,CapabilitySet *capabilities,
          ExtensionSet *extensions)

{
  Op opcode;
  pointer pOVar1;
  ulong uVar2;
  ulong uVar3;
  _Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
  _Var4;
  ulong uVar5;
  _Node_const_iterator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_false,_true>
  __tmp;
  pair<std::__detail::_Node_const_iterator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_false,_true>_>
  pVar6;
  optional<spv::Capability> result;
  ulong local_58;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_50;
  
  opcode = instruction->opcode_;
  if ((opcode != OpExtension) && (opcode != OpCapability)) {
    if (opcode == OpExtInst) {
      addInstructionRequirementsForExtInst(this,instruction,capabilities);
    }
    else {
      addInstructionRequirementsForOpcode(this,opcode,capabilities,extensions);
    }
    uVar2 = ((long)(instruction->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(instruction->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    if ((int)uVar2 != 0) {
      uVar5 = 0;
      do {
        pOVar1 = (instruction->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar3 = ((long)(instruction->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 4) *
                -0x5555555555555555;
        if (uVar3 < uVar5 || uVar3 - uVar5 == 0) {
          __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
        }
        addInstructionRequirementsForOperand(this,pOVar1 + uVar5,capabilities,extensions);
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uVar2 & 0xffffffff));
    }
    local_50.first.set_._0_4_ = instruction->opcode_;
    pVar6 = std::
            _Hashtable<spv::Op,_std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_std::allocator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ClassEnumHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
            ::equal_range(&(this->opcodeHandlers_)._M_h,(key_type *)&local_50);
    _Var4._M_cur = (__node_type *)
                   pVar6.first.
                   super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
                   ._M_cur;
    if ((_Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
         )_Var4._M_cur !=
        pVar6.second.
        super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
       ) {
      do {
        local_58 = (**(code **)((long)&((_Var4._M_cur)->
                                       super__Hash_node_value<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>_>
                                       ._M_storage._M_storage + 8))(instruction);
        if ((local_58 >> 0x20 & 1) != 0) {
          EnumSet<spv::Capability>::insert(&local_50,capabilities,(Capability *)&local_58);
        }
        _Var4._M_cur = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt;
      } while ((_Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
                )_Var4._M_cur !=
               pVar6.second.
               super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
               ._M_cur.
               super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
              );
    }
  }
  return;
}

Assistant:

void TrimCapabilitiesPass::addInstructionRequirements(
    Instruction* instruction, CapabilitySet* capabilities,
    ExtensionSet* extensions) const {
  // Ignoring OpCapability and OpExtension instructions.
  if (instruction->opcode() == spv::Op::OpCapability ||
      instruction->opcode() == spv::Op::OpExtension) {
    return;
  }

  if (instruction->opcode() == spv::Op::OpExtInst) {
    addInstructionRequirementsForExtInst(instruction, capabilities);
  } else {
    addInstructionRequirementsForOpcode(instruction->opcode(), capabilities,
                                        extensions);
  }

  // Second case: one of the opcode operand is gated by a capability.
  const uint32_t operandCount = instruction->NumOperands();
  for (uint32_t i = 0; i < operandCount; i++) {
    addInstructionRequirementsForOperand(instruction->GetOperand(i),
                                         capabilities, extensions);
  }

  // Last case: some complex logic needs to be run to determine capabilities.
  auto[begin, end] = opcodeHandlers_.equal_range(instruction->opcode());
  for (auto it = begin; it != end; it++) {
    const OpcodeHandler handler = it->second;
    auto result = handler(instruction);
    if (!result.has_value()) {
      continue;
    }

    capabilities->insert(*result);
  }
}